

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::param::Atlas::addMesh(Atlas *this,TaskScheduler *taskScheduler,Mesh *mesh)

{
  uint32_t uVar1;
  TaskGroupHandle handle;
  CreateChartGroupTaskArgs *pCVar2;
  ChartGroup **ppCVar3;
  uint16_t uVar4;
  uint32_t g;
  uint uVar5;
  Task task;
  Array<xatlas::internal::param::ChartGroup_*> chartGroups;
  TaskGroupHandle taskGroup;
  Array<xatlas::internal::param::CreateChartGroupTaskArgs> taskArgs;
  ArrayBase local_68;
  uint32_t local_50;
  uint32_t local_4c;
  ArrayBase local_48;
  
  local_68.buffer = (uint8_t *)0x0;
  local_68.elementSize = 8;
  local_68.size = 0;
  local_68.capacity = 0;
  uVar1 = Mesh::faceGroupCount(mesh);
  Array<xatlas::internal::param::ChartGroup_*>::resize
            ((Array<xatlas::internal::param::ChartGroup_*> *)&local_68,
             (uVar1 + 1) - (uint)(mesh->m_ignoredFaceCount == 0));
  local_48.buffer = (uint8_t *)0x0;
  local_48.elementSize = 0x18;
  local_48.size = 0;
  local_48.capacity = 0;
  Array<xatlas::internal::param::CreateChartGroupTaskArgs>::resize
            ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)&local_48,local_68.size);
  for (uVar5 = 0; uVar5 < local_68.size; uVar5 = uVar5 + 1) {
    pCVar2 = Array<xatlas::internal::param::CreateChartGroupTaskArgs>::operator[]
                       ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)&local_48,uVar5)
    ;
    ppCVar3 = Array<xatlas::internal::param::ChartGroup_*>::operator[]
                        ((Array<xatlas::internal::param::ChartGroup_*> *)&local_68,uVar5);
    pCVar2->chartGroup = ppCVar3;
    uVar1 = Mesh::faceGroupCount(mesh);
    uVar4 = (uint16_t)uVar5;
    if (uVar1 <= uVar5) {
      uVar4 = 0xffff;
    }
    pCVar2->faceGroup = uVar4;
    pCVar2->groupId = uVar5;
    pCVar2->mesh = mesh;
  }
  handle = TaskScheduler::createTaskGroup(taskScheduler,local_68.size);
  local_4c = handle.value;
  for (uVar5 = 0; uVar5 < local_68.size; uVar5 = uVar5 + 1) {
    pCVar2 = Array<xatlas::internal::param::CreateChartGroupTaskArgs>::operator[]
                       ((Array<xatlas::internal::param::CreateChartGroupTaskArgs> *)&local_48,uVar5)
    ;
    task.userData = pCVar2;
    task.func = runCreateChartGroupTask;
    TaskScheduler::run(taskScheduler,handle,task);
  }
  TaskScheduler::wait(taskScheduler,&local_4c);
  std::mutex::lock(&this->m_addMeshMutex);
  for (uVar5 = 0; uVar5 < local_68.size; uVar5 = uVar5 + 1) {
    ppCVar3 = Array<xatlas::internal::param::ChartGroup_*>::operator[]
                        ((Array<xatlas::internal::param::ChartGroup_*> *)&local_68,uVar5);
    ArrayBase::push_back(&(this->m_chartGroups).m_base,(uint8_t *)ppCVar3);
    local_50 = mesh->m_id;
    ArrayBase::push_back(&(this->m_chartGroupSourceMeshes).m_base,(uint8_t *)&local_50);
  }
  this->m_meshCount = this->m_meshCount + 1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  ArrayBase::~ArrayBase(&local_48);
  ArrayBase::~ArrayBase(&local_68);
  return;
}

Assistant:

void addMesh(TaskScheduler *taskScheduler, const Mesh *mesh)
	{
		// Create one chart group per face group.
		// If there's any ignored faces in the mesh, create an extra face group for that (vertex map).
		// Chart group creation is slow since it copies a chunk of the source mesh, so use tasks.
		Array<ChartGroup *> chartGroups;
		chartGroups.resize(mesh->faceGroupCount() + (mesh->ignoredFaceCount() > 0 ? 1 : 0));
		Array<CreateChartGroupTaskArgs> taskArgs;
		taskArgs.resize(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			CreateChartGroupTaskArgs &args = taskArgs[g];
			args.chartGroup = &chartGroups[g];
			args.faceGroup = uint16_t(g < mesh->faceGroupCount() ? g : Mesh::kInvalidFaceGroup);
			args.groupId = g;
			args.mesh = mesh;
		}
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			Task task;
			task.userData = &taskArgs[g];
			task.func = runCreateChartGroupTask;
			taskScheduler->run(taskGroup, task);
		}
		taskScheduler->wait(&taskGroup);
		// Thread-safe append.
		m_addMeshMutex.lock();
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			m_chartGroups.push_back(chartGroups[g]);
			m_chartGroupSourceMeshes.push_back(mesh->id());
		}
		m_meshCount++;
		m_addMeshMutex.unlock();
	}